

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_fields_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::
TestBody(VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test *this)

{
  DescriptorPool *field;
  KeyValue *pKVar1;
  FieldDescriptor *field_00;
  byte bVar2;
  int iVar3;
  _Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  this_00;
  Descriptor *pDVar4;
  long lVar5;
  Message *this_01;
  bool bVar6;
  int iVar7;
  CppStringType CVar8;
  FieldDescriptor *pFVar9;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar10;
  RepeatedPtrFieldBase *pRVar11;
  RepeatedPtrField<google::protobuf::Message> *pRVar12;
  MapFieldBase *this_02;
  Descriptor *this_03;
  ExtensionSet *pEVar13;
  SooRep *this_04;
  ulong extraout_RAX;
  undefined8 extraout_RAX_00;
  Reflection *pRVar14;
  long lVar15;
  KeyValue *pKVar16;
  _func_int **message;
  KeyValue *pKVar17;
  uint uVar18;
  long lVar19;
  Metadata MVar20;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  uint32_t count;
  Descriptor *extendee;
  undefined1 local_108 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> _Stack_100;
  DescriptorPool *local_f8;
  FieldDescriptor *pFStack_f0;
  FieldDescriptor *local_e8;
  TcParseTableBase *pTStack_e0;
  uint32_t *local_d8;
  undefined1 local_cc [4];
  undefined1 auStack_c8 [40];
  uint32_t *local_a0;
  ReflectionSchema *local_98;
  undefined1 local_8c [4];
  MapDynamicFieldInfo<google::protobuf::Message> local_88;
  FieldDescriptor *local_58;
  MapFieldBase *local_50;
  VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test *local_48;
  undefined1 local_40 [16];
  
  this_00.
  super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl = (_Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                  )(this->super_VisitFieldsTest).message_;
  auStack_c8._0_4_ = 0xffffffff;
  MVar20 = Message::GetMetadata
                     ((Message *)
                      this_00.
                      super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                      ._M_head_impl);
  pRVar14 = MVar20.reflection;
  if ((pRVar14->schema_).weak_field_map_offset_ < 1) {
    local_48 = this;
    if ((pRVar14->schema_).has_bits_offset_ == -1) {
      local_d8 = (uint32_t *)0x0;
    }
    else {
      local_d8 = Reflection::GetHasBits
                           (pRVar14,(Message *)
                                    this_00.
                                    super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                    ._M_head_impl);
    }
    pDVar4 = pRVar14->descriptor_;
    iVar3 = pDVar4->field_count_;
    if (0 < (long)iVar3) {
      local_98 = &pRVar14->schema_;
      local_a0 = (pRVar14->schema_).has_bit_indices_;
      lVar19 = 0;
      lVar15 = 0;
      do {
        if (pDVar4->field_count_ <= lVar15) {
          internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
LAB_008eea2f:
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_108,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                     ,0x6e,"!field->options().weak()");
          str._M_str = "weak fields are not supported";
          str._M_len = 0x1d;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    ((LogMessage *)local_108,str);
          goto LAB_008eec14;
        }
        pFVar9 = pDVar4->fields_;
        if (*(char *)(*(long *)((long)&pFVar9->options_ + lVar19) + 0x87) == '\x01')
        goto LAB_008eea2f;
        if ((auStack_c8._0_4_ != 0xffffffff) &&
           (((uint)auStack_c8._0_4_ >>
             (*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar9->type_)[lVar19] * 4) &
             0x1f) & 1) == 0)) goto LAB_008ee25c;
        bVar2 = (&pFVar9->field_0x1)[lVar19];
        if (0xbf < bVar2 != (bool)((bVar2 & 0x20) >> 5)) {
          internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
          goto LAB_008eea7e;
        }
        field = (DescriptorPool *)(&pFVar9->super_SymbolBase + lVar19);
        if ((bVar2 & 0x20) == 0) {
          bVar6 = ReflectionSchema::InRealOneof(local_98,(FieldDescriptor *)field);
          if (bVar6) {
            lVar5 = *(long *)((long)&pFVar9->scope_ + lVar19);
            if (lVar5 == 0) goto LAB_008eeb87;
            if ((ulong)*(uint *)((ulong)(uint)(pRVar14->schema_).oneof_case_offset_ +
                                 (long)this_00.
                                       super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                       ._M_head_impl +
                                (long)((int)((ulong)(lVar5 - *(long *)(*(long *)(lVar5 + 0x10) +
                                                                      0x48)) >> 3) * -0x49249249) *
                                4) != (long)*(int *)((long)&pFVar9->number_ + lVar19))
            goto LAB_008ee25c;
            switch((&pFVar9->type_)[lVar19]) {
            case '\t':
            case '\f':
              CVar8 = FieldDescriptor::cpp_string_type((FieldDescriptor *)field);
              if (((CVar8 != kView) && (CVar8 != kString)) && (CVar8 != kCord)) break;
            case '\x01':
            case '\x02':
            case '\x03':
            case '\x04':
            case '\x05':
            case '\x06':
            case '\a':
            case '\b':
            case '\r':
            case '\x0e':
            case '\x0f':
            case '\x10':
            case '\x11':
            case '\x12':
              Reflection::ClearOneofField
                        (pRVar14,(Message *)
                                 this_00.
                                 super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                 ._M_head_impl,(FieldDescriptor *)field);
              break;
            case '\n':
            case '\v':
              goto switchD_008edf48_caseD_a;
            default:
              goto switchD_008edf48_default;
            }
          }
          else if ((local_d8 == (uint32_t *)0x0) ||
                  (uVar18 = local_a0[lVar15], uVar18 == 0xffffffff)) {
            bVar6 = Reflection::HasFieldSingular
                              (pRVar14,(Message *)
                                       this_00.
                                       super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                       ._M_head_impl,(FieldDescriptor *)field);
            if (bVar6) goto LAB_008edf95;
          }
          else if ((local_d8[uVar18 >> 5] >> (uVar18 & 0x1f) & 1) != 0) {
LAB_008edf95:
            switch((&pFVar9->type_)[lVar19]) {
            case '\t':
            case '\f':
              CVar8 = FieldDescriptor::cpp_string_type((FieldDescriptor *)field);
              if (((CVar8 != kView) && (CVar8 != kString)) && (CVar8 != kCord)) break;
            case '\x01':
            case '\x02':
            case '\x03':
            case '\x04':
            case '\x05':
            case '\x06':
            case '\a':
            case '\b':
            case '\n':
            case '\v':
            case '\r':
            case '\x0e':
            case '\x0f':
            case '\x10':
            case '\x11':
            case '\x12':
switchD_008edf48_caseD_a:
              Reflection::ClearField
                        (pRVar14,(Message *)
                                 this_00.
                                 super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                 ._M_head_impl,(FieldDescriptor *)field);
              break;
            default:
              goto switchD_008edfb4_default;
            }
          }
        }
        else {
          switch((&pFVar9->type_)[lVar19]) {
          case '\x01':
            pFVar9 = (FieldDescriptor *)
                     Reflection::GetRawNonOneof<google::protobuf::RepeatedField<double>>
                               (pRVar14,(Message *)
                                        this_00.
                                        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                        ._M_head_impl,(FieldDescriptor *)field);
            iVar7 = SooRep::size((SooRep *)pFVar9,
                                 (undefined1  [16])
                                 ((undefined1  [16])
                                  *(anon_union_16_2_b9f6da03_for_SooRep_0 *)
                                   &pFVar9->super_SymbolBase & (undefined1  [16])0x4) ==
                                 (undefined1  [16])0x0);
            if (iVar7 != 0) {
              local_108 = (undefined1  [8])pRVar14;
              _Stack_100._M_head_impl =
                   (LogMessageData *)
                   this_00.
                   super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                   ._M_head_impl;
              local_f8 = field;
              pFStack_f0 = pFVar9;
              RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_double>::Clear
                        ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_double> *)
                         local_108);
            }
            break;
          case '\x02':
            pFVar9 = (FieldDescriptor *)
                     Reflection::GetRawNonOneof<google::protobuf::RepeatedField<float>>
                               (pRVar14,(Message *)
                                        this_00.
                                        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                        ._M_head_impl,(FieldDescriptor *)field);
            iVar7 = SooRep::size((SooRep *)pFVar9,
                                 (undefined1  [16])
                                 ((undefined1  [16])
                                  *(anon_union_16_2_b9f6da03_for_SooRep_0 *)
                                   &pFVar9->super_SymbolBase & (undefined1  [16])0x4) ==
                                 (undefined1  [16])0x0);
            if (iVar7 != 0) {
              local_108 = (undefined1  [8])pRVar14;
              _Stack_100._M_head_impl =
                   (LogMessageData *)
                   this_00.
                   super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                   ._M_head_impl;
              local_f8 = field;
              pFStack_f0 = pFVar9;
              RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_float>::Clear
                        ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_float> *)
                         local_108);
            }
            break;
          case '\x03':
          case '\x10':
          case '\x12':
            pFVar9 = (FieldDescriptor *)
                     Reflection::GetRawNonOneof<google::protobuf::RepeatedField<long>>
                               (pRVar14,(Message *)
                                        this_00.
                                        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                        ._M_head_impl,(FieldDescriptor *)field);
            iVar7 = SooRep::size((SooRep *)pFVar9,
                                 (undefined1  [16])
                                 ((undefined1  [16])
                                  *(anon_union_16_2_b9f6da03_for_SooRep_0 *)
                                   &pFVar9->super_SymbolBase & (undefined1  [16])0x4) ==
                                 (undefined1  [16])0x0);
            if (iVar7 != 0) {
              local_108 = (undefined1  [8])pRVar14;
              _Stack_100._M_head_impl =
                   (LogMessageData *)
                   this_00.
                   super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                   ._M_head_impl;
              local_f8 = field;
              pFStack_f0 = pFVar9;
              RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>::Clear
                        ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long> *)
                         local_108);
            }
            break;
          case '\x04':
          case '\x06':
            pFVar9 = (FieldDescriptor *)
                     Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_long>>
                               (pRVar14,(Message *)
                                        this_00.
                                        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                        ._M_head_impl,(FieldDescriptor *)field);
            iVar7 = SooRep::size((SooRep *)pFVar9,
                                 (undefined1  [16])
                                 ((undefined1  [16])
                                  *(anon_union_16_2_b9f6da03_for_SooRep_0 *)
                                   &pFVar9->super_SymbolBase & (undefined1  [16])0x4) ==
                                 (undefined1  [16])0x0);
            if (iVar7 != 0) {
              local_108 = (undefined1  [8])pRVar14;
              _Stack_100._M_head_impl =
                   (LogMessageData *)
                   this_00.
                   super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                   ._M_head_impl;
              local_f8 = field;
              pFStack_f0 = pFVar9;
              RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>::Clear
                        ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>
                          *)local_108);
            }
            break;
          case '\x05':
          case '\x0e':
          case '\x0f':
          case '\x11':
            pFVar9 = (FieldDescriptor *)
                     Reflection::GetRawNonOneof<google::protobuf::RepeatedField<int>>
                               (pRVar14,(Message *)
                                        this_00.
                                        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                        ._M_head_impl,(FieldDescriptor *)field);
            iVar7 = SooRep::size((SooRep *)pFVar9,
                                 (undefined1  [16])
                                 ((undefined1  [16])
                                  *(anon_union_16_2_b9f6da03_for_SooRep_0 *)
                                   &pFVar9->super_SymbolBase & (undefined1  [16])0x4) ==
                                 (undefined1  [16])0x0);
            if (iVar7 != 0) {
              local_108 = (undefined1  [8])pRVar14;
              _Stack_100._M_head_impl =
                   (LogMessageData *)
                   this_00.
                   super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                   ._M_head_impl;
              local_f8 = field;
              pFStack_f0 = pFVar9;
              RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>::Clear
                        ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int> *)
                         local_108);
            }
            break;
          case '\a':
          case '\r':
            pFVar9 = (FieldDescriptor *)
                     Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_int>>
                               (pRVar14,(Message *)
                                        this_00.
                                        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                        ._M_head_impl,(FieldDescriptor *)field);
            iVar7 = SooRep::size((SooRep *)pFVar9,
                                 (undefined1  [16])
                                 ((undefined1  [16])
                                  *(anon_union_16_2_b9f6da03_for_SooRep_0 *)
                                   &pFVar9->super_SymbolBase & (undefined1  [16])0x4) ==
                                 (undefined1  [16])0x0);
            if (iVar7 != 0) {
              local_108 = (undefined1  [8])pRVar14;
              _Stack_100._M_head_impl =
                   (LogMessageData *)
                   this_00.
                   super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                   ._M_head_impl;
              local_f8 = field;
              pFStack_f0 = pFVar9;
              RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>::Clear
                        ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>
                          *)local_108);
            }
            break;
          case '\b':
            pFVar9 = (FieldDescriptor *)
                     Reflection::GetRawNonOneof<google::protobuf::RepeatedField<bool>>
                               (pRVar14,(Message *)
                                        this_00.
                                        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                        ._M_head_impl,(FieldDescriptor *)field);
            iVar7 = SooRep::size((SooRep *)pFVar9,
                                 (undefined1  [16])
                                 ((undefined1  [16])
                                  *(anon_union_16_2_b9f6da03_for_SooRep_0 *)
                                   &pFVar9->super_SymbolBase & (undefined1  [16])0x4) ==
                                 (undefined1  [16])0x0);
            if (iVar7 != 0) {
              local_108 = (undefined1  [8])pRVar14;
              _Stack_100._M_head_impl =
                   (LogMessageData *)
                   this_00.
                   super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                   ._M_head_impl;
              local_f8 = field;
              pFStack_f0 = pFVar9;
              RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_bool>::Clear
                        ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_bool> *)
                         local_108);
            }
            break;
          case '\t':
          case '\f':
            CVar8 = FieldDescriptor::cpp_string_type((FieldDescriptor *)field);
            if ((CVar8 - kView < 3) &&
               (pRVar10 = Reflection::
                          GetRawNonOneof<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                                    (pRVar14,(Message *)
                                             this_00.
                                             super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                             ._M_head_impl,(FieldDescriptor *)field),
               (pRVar10->super_RepeatedPtrFieldBase).current_size_ != 0)) {
              pRVar11 = (RepeatedPtrFieldBase *)
                        Reflection::MutableRawRepeatedString
                                  (pRVar14,(Message *)
                                           this_00.
                                           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                           ._M_head_impl,(FieldDescriptor *)field,true);
              RepeatedPtrFieldBase::
              Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>(pRVar11);
            }
            break;
          case '\n':
LAB_008ee12e:
            pRVar12 = Reflection::
                      GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                                (pRVar14,(Message *)
                                         this_00.
                                         super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                         ._M_head_impl,(FieldDescriptor *)field);
            if ((pRVar12->super_RepeatedPtrFieldBase).current_size_ != 0) {
              pRVar11 = (RepeatedPtrFieldBase *)
                        Reflection::MutableRawRepeatedField
                                  (pRVar14,(Message *)
                                           this_00.
                                           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                           ._M_head_impl,(FieldDescriptor *)field,CPPTYPE_MESSAGE,-1
                                   ,(Descriptor *)0x0);
              RepeatedPtrFieldBase::
              Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                        (pRVar11);
            }
            break;
          case '\v':
            bVar6 = FieldDescriptor::is_map_message_type((FieldDescriptor *)field);
            if (!bVar6) goto LAB_008ee12e;
            this_02 = Reflection::GetRawNonOneof<google::protobuf::internal::MapFieldBase>
                                (pRVar14,(Message *)
                                         this_00.
                                         super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                         ._M_head_impl,(FieldDescriptor *)field);
            iVar7 = MapFieldBase::size(this_02);
            if (iVar7 != 0) {
              this_03 = FieldDescriptor::message_type((FieldDescriptor *)field);
              local_50 = this_02;
              local_58 = Descriptor::map_key(this_03);
              pFVar9 = Descriptor::map_value(this_03);
              MapDynamicFieldInfo<google::protobuf::Message>::MapDynamicFieldInfo
                        (&local_88,pRVar14,
                         (Message *)
                         this_00.
                         super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                         ._M_head_impl,(FieldDescriptor *)field,local_58,pFVar9,local_50);
              local_e8 = local_88.value;
              pTStack_e0 = (TcParseTableBase *)local_88.const_map_field;
              local_f8 = (DescriptorPool *)local_88.field;
              pFStack_f0 = local_88.key;
              local_108 = (undefined1  [8])local_88.reflection;
              _Stack_100._M_head_impl = (LogMessageData *)local_88.message;
              MapDynamicFieldInfo<google::protobuf::Message>::Clear
                        ((MapDynamicFieldInfo<google::protobuf::Message> *)local_108);
            }
            break;
          default:
            internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
            goto switchD_008ee5d6_default;
          }
        }
LAB_008ee25c:
        lVar15 = lVar15 + 1;
        lVar19 = lVar19 + 0x58;
      } while (iVar3 != lVar15);
    }
    if ((pRVar14->schema_).extensions_offset_ != -1) {
      pEVar13 = Reflection::MutableExtensionSet
                          (pRVar14,(Message *)
                                   this_00.
                                   super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                                   ._M_head_impl);
      local_40._8_8_ = pRVar14->descriptor_;
      auStack_c8._32_8_ = local_40 + 8;
      local_40._0_8_ = pRVar14->descriptor_pool_;
      auStack_c8._24_8_ = local_40;
      auStack_c8._8_8_ = auStack_c8;
      auStack_c8._16_8_ = local_cc;
      lVar15 = (long)(short)pEVar13->flat_size_;
      pKVar16 = (pEVar13->map_).flat;
      if (lVar15 < 0) {
        internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
      }
      else {
        lVar19 = lVar15 * 0x20;
        pKVar1 = pKVar16 + lVar15;
        pKVar17 = pKVar16;
        local_108 = (undefined1  [8])auStack_c8._8_8_;
        _Stack_100._M_head_impl = (LogMessageData *)auStack_c8._16_8_;
        local_f8 = (DescriptorPool *)auStack_c8._24_8_;
        pFStack_f0 = (FieldDescriptor *)auStack_c8._32_8_;
        if (pEVar13->flat_size_ != 0) {
          uVar18 = 0;
          do {
            lVar19 = lVar19 + -0x20;
            ExtensionSet::Extension::PrefetchPtr(&pKVar17->second);
            pKVar17 = pKVar17 + 1;
            if (lVar19 == 0) break;
            bVar6 = uVar18 < 0xf;
            uVar18 = uVar18 + 1;
          } while (bVar6);
        }
        if (pKVar17 != pKVar1) {
          do {
            ReflectionVisit::
            VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_0>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_0&&,google::protobuf::internal::FieldMask)
            ::{lambda(int,auto:1&)#1}::operator()(local_108,pKVar16->first,&pKVar16->second);
            ExtensionSet::Extension::PrefetchPtr(&pKVar17->second);
            pKVar16 = pKVar16 + 1;
            pKVar17 = pKVar17 + 1;
          } while (pKVar17 != pKVar1);
        }
        if (pKVar16 != pKVar1) {
          do {
            ReflectionVisit::
            VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_0>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_0&&,google::protobuf::internal::FieldMask)
            ::{lambda(int,auto:1&)#1}::operator()(local_108,pKVar16->first,&pKVar16->second);
            pKVar16 = pKVar16 + 1;
          } while (pKVar16 != pKVar1);
        }
      }
    }
    auStack_c8._0_8_ = local_8c;
    local_8c = (undefined1  [4])0x0;
    this_01 = (local_48->super_VisitFieldsTest).message_;
    local_cc = (undefined1  [4])0xffffffff;
    MVar20 = Message::GetMetadata(this_01);
    pRVar14 = MVar20.reflection;
    if ((pRVar14->schema_).weak_field_map_offset_ < 1) {
      if ((pRVar14->schema_).has_bits_offset_ == -1) {
        local_d8 = (uint32_t *)0x0;
      }
      else {
        local_d8 = Reflection::GetHasBits(pRVar14,this_01);
      }
      pDVar4 = pRVar14->descriptor_;
      iVar3 = pDVar4->field_count_;
      if (0 < (long)iVar3) {
        local_98 = &pRVar14->schema_;
        local_a0 = (pRVar14->schema_).has_bit_indices_;
        lVar15 = 0;
        lVar19 = 0;
        do {
          if (pDVar4->field_count_ <= lVar19) {
LAB_008eea7e:
            internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
LAB_008eea8e:
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_88,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                       ,0x6e,"!field->options().weak()");
            str_00._M_str = "weak fields are not supported";
            str_00._M_len = 0x1d;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      ((LogMessage *)&local_88,str_00);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_88);
          }
          pFVar9 = pDVar4->fields_;
          if (*(char *)(*(long *)((long)&pFVar9->options_ + lVar15) + 0x87) == '\x01')
          goto LAB_008eea8e;
          if ((local_cc != (undefined1  [4])0xffffffff) &&
             (((uint)local_cc >>
               (*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar9->type_)[lVar15] * 4)
               & 0x1f) & 1) == 0)) goto LAB_008ee7be;
          bVar2 = (&pFVar9->field_0x1)[lVar15];
          if (0xbf < bVar2 != (bool)((bVar2 & 0x20) >> 5)) {
            internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
            goto LAB_008eeae3;
          }
          field_00 = (FieldDescriptor *)(&pFVar9->super_SymbolBase + lVar15);
          if ((bVar2 & 0x20) == 0) {
            bVar6 = ReflectionSchema::InRealOneof(local_98,field_00);
            if (bVar6) {
              lVar5 = *(long *)((long)&pFVar9->scope_ + lVar15);
              if (lVar5 == 0) {
LAB_008eeb87:
                protobuf_assumption_failed
                          ("res != nullptr",
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                           ,0xb31);
              }
              if ((ulong)*(uint *)((long)&(this_01->super_MessageLite)._vptr_MessageLite +
                                  (long)((int)((ulong)(lVar5 - *(long *)(*(long *)(lVar5 + 0x10) +
                                                                        0x48)) >> 3) * -0x49249249)
                                  * 4 + (ulong)(uint)(pRVar14->schema_).oneof_case_offset_) !=
                  (long)*(int *)((long)&pFVar9->number_ + lVar15)) goto LAB_008ee7be;
              bVar2 = (&pFVar9->type_)[lVar15];
              if (0x12 < bVar2) goto LAB_008eebb8;
              if ((0x7edfeU >> (bVar2 & 0x1f) & 1) != 0) goto LAB_008ee7b7;
              if ((0x1200U >> (bVar2 & 0x1f) & 1) == 0) goto LAB_008eebb8;
LAB_008ee6ca:
              CVar8 = FieldDescriptor::cpp_string_type(field_00);
              if (CVar8 - kView < 3) goto LAB_008ee7b7;
            }
            else {
              if ((local_d8 != (uint32_t *)0x0) && (uVar18 = local_a0[lVar19], uVar18 != 0xffffffff)
                 ) {
                if ((local_d8[uVar18 >> 5] >> (uVar18 & 0x1f) & 1) != 0) goto LAB_008ee69f;
                goto LAB_008ee7be;
              }
              bVar6 = Reflection::HasFieldSingular(pRVar14,this_01,field_00);
              if (bVar6) {
LAB_008ee69f:
                bVar2 = (&pFVar9->type_)[lVar15];
                if (bVar2 < 0x13) {
                  if ((0x7edfeU >> (bVar2 & 0x1f) & 1) != 0) goto LAB_008ee7b7;
                  if ((0x1200U >> (bVar2 & 0x1f) & 1) != 0) goto LAB_008ee6ca;
                }
                goto LAB_008eebae;
              }
            }
          }
          else {
            switch((&pFVar9->type_)[lVar15]) {
            case '\x01':
              this_04 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<double>>
                                   (pRVar14,this_01,field_00)->soo_rep_;
              break;
            case '\x02':
              this_04 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<float>>
                                   (pRVar14,this_01,field_00)->soo_rep_;
              break;
            case '\x03':
            case '\x10':
            case '\x12':
              this_04 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<long>>
                                   (pRVar14,this_01,field_00)->soo_rep_;
              break;
            case '\x04':
            case '\x06':
              this_04 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_long>>
                                   (pRVar14,this_01,field_00)->soo_rep_;
              break;
            case '\x05':
            case '\x0e':
            case '\x0f':
            case '\x11':
              this_04 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<int>>
                                   (pRVar14,this_01,field_00)->soo_rep_;
              break;
            case '\a':
            case '\r':
              this_04 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_int>>
                                   (pRVar14,this_01,field_00)->soo_rep_;
              break;
            case '\b':
              this_04 = &Reflection::GetRawNonOneof<google::protobuf::RepeatedField<bool>>
                                   (pRVar14,this_01,field_00)->soo_rep_;
              break;
            case '\t':
            case '\f':
              CVar8 = FieldDescriptor::cpp_string_type(field_00);
              if (2 < CVar8 - kView) goto LAB_008ee7be;
              pRVar10 = Reflection::
                        GetRawNonOneof<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                                  (pRVar14,this_01,field_00);
              goto LAB_008ee766;
            case '\n':
switchD_008ee5d6_caseD_a:
              pRVar10 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)Reflection::
                           GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                                     (pRVar14,this_01,field_00);
LAB_008ee766:
              iVar7 = (pRVar10->super_RepeatedPtrFieldBase).current_size_;
              goto joined_r0x008ee76a;
            case '\v':
              bVar6 = FieldDescriptor::is_map_message_type(field_00);
              if (!bVar6) goto switchD_008ee5d6_caseD_a;
              internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()
              ;
              if ((extraout_RAX & 1) != 0) goto LAB_008ee7be;
              goto LAB_008ee7b7;
            default:
              goto switchD_008ee5d6_default;
            }
            iVar7 = SooRep::size(this_04,(undefined1  [16])
                                         ((undefined1  [16])this_04->field_0 & (undefined1  [16])0x4
                                         ) == (undefined1  [16])0x0);
joined_r0x008ee76a:
            if (iVar7 != 0) {
LAB_008ee7b7:
              *(int *)auStack_c8._0_8_ = *(int *)auStack_c8._0_8_ + 1;
            }
          }
LAB_008ee7be:
          lVar19 = lVar19 + 1;
          lVar15 = lVar15 + 0x58;
        } while (iVar3 != lVar19);
      }
      if ((pRVar14->schema_).extensions_offset_ != -1) {
        pEVar13 = Reflection::MutableExtensionSet(pRVar14,this_01);
        local_40._8_8_ = pRVar14->descriptor_;
        auStack_c8._32_8_ = local_40 + 8;
        local_40._0_8_ = pRVar14->descriptor_pool_;
        auStack_c8._24_8_ = local_40;
        auStack_c8._8_8_ = local_cc;
        auStack_c8._16_8_ = auStack_c8;
        lVar15 = (long)(short)pEVar13->flat_size_;
        pKVar16 = (pEVar13->map_).flat;
        if (lVar15 < 0) {
          internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
        }
        else {
          lVar19 = lVar15 * 0x20;
          pKVar1 = pKVar16 + lVar15;
          pKVar17 = pKVar16;
          local_88.reflection = (Reflection *)auStack_c8._8_8_;
          local_88.message = (Message *)auStack_c8._16_8_;
          local_88.field = (FieldDescriptor *)auStack_c8._24_8_;
          local_88.key = (FieldDescriptor *)auStack_c8._32_8_;
          if (pEVar13->flat_size_ != 0) {
            uVar18 = 0;
            do {
              lVar19 = lVar19 + -0x20;
              ExtensionSet::Extension::PrefetchPtr(&pKVar17->second);
              pKVar17 = pKVar17 + 1;
              if (lVar19 == 0) break;
              bVar6 = uVar18 < 0xf;
              uVar18 = uVar18 + 1;
            } while (bVar6);
          }
          if (pKVar17 != pKVar1) {
            do {
              ReflectionVisit::
              VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_1>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_1&&,google::protobuf::internal::FieldMask)
              ::{lambda(int,auto:1&)#1}::operator()(&local_88,pKVar16->first,&pKVar16->second);
              ExtensionSet::Extension::PrefetchPtr(&pKVar17->second);
              pKVar16 = pKVar16 + 1;
              pKVar17 = pKVar17 + 1;
            } while (pKVar17 != pKVar1);
          }
          if (pKVar16 != pKVar1) {
            do {
              ReflectionVisit::
              VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_1>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody()::$_1&&,google::protobuf::internal::FieldMask)
              ::{lambda(int,auto:1&)#1}::operator()(&local_88,pKVar16->first,&pKVar16->second);
              pKVar16 = pKVar16 + 1;
            } while (pKVar16 != pKVar1);
          }
        }
      }
      local_88.reflection = (Reflection *)((ulong)local_88.reflection & 0xffffffff00000000);
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)local_108,"count","0",(uint *)local_8c,(int *)&local_88);
      if (local_108[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_88);
        if (_Stack_100._M_head_impl == (LogMessageData *)0x0) {
          message = (_func_int **)(anon_var_dwarf_a22956 + 5);
        }
        else {
          message = (_func_int **)((_Stack_100._M_head_impl)->entry).full_filename_._M_len;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)(auStack_c8 + 8),kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields_test.cc"
                   ,0x88,(char *)message);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)(auStack_c8 + 8),(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(auStack_c8 + 8));
        if (local_88.reflection != (Reflection *)0x0) {
          (**(code **)&(local_88.reflection)->descriptor_->field_count_)();
        }
      }
      if (_Stack_100._M_head_impl != (LogMessageData *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&_Stack_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Stack_100._M_head_impl);
      }
      return;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
               ,99,"!schema.HasWeakFields()");
    str_02._M_str = "weak fields are not supported";
    str_02._M_len = 0x1d;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)local_108,str_02);
  }
  else {
LAB_008eeae3:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
               ,99,"!schema.HasWeakFields()");
    str_01._M_str = "weak fields are not supported";
    str_01._M_len = 0x1d;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)local_108,str_01);
  }
LAB_008eec14:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_108);
switchD_008ee5d6_default:
  internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
switchD_008edfb4_default:
  internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
LAB_008eebae:
  internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
switchD_008edf48_default:
  internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
LAB_008eebb8:
  internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsRevisitNone_Test::TestBody();
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(auStack_c8 + 8));
  if (local_88.reflection != (Reflection *)0x0) {
    (**(code **)&(local_88.reflection)->descriptor_->field_count_)();
  }
  if ((_Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
       )_Stack_100._M_head_impl != (LogMessageData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_100._M_head_impl);
  }
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

TEST_P(VisitFieldsTest, ClearByVisitFieldsRevisitNone) {
  VisitFields(*message_, [](auto info) { info.Clear(); });

  uint32_t count = 0;
  VisitFields(*message_, [&](auto info) { ++count; });

  EXPECT_EQ(count, 0);
}